

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O2

int __thiscall MemoryMappedFile::close(MemoryMappedFile *this,int __fd)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  Log LStack_88;
  Log local_78;
  char local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Log local_38;
  Log local_28;
  
  if (this->mpMapped != (void *)0x0) {
    iVar2 = munmap(this->mpMapped,this->mFileSize);
    if (iVar2 != 0) {
      error();
      Log::operator<<((Log *)(local_58 + 0x10),local_68);
      operator<<(&LStack_88,(String *)(local_58 + 0x10));
      Log::operator<<(&local_78,(char *)&LStack_88);
      __errno_location();
      Log::addStringStream<int>(&local_28,(int)&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_28.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&LStack_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    }
  }
  if (this->mFd != -1) {
    do {
      iVar2 = ::close(this->mFd);
      if (iVar2 != -1) goto LAB_0018b115;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    error();
    Log::operator<<((Log *)local_58,local_68);
    operator<<(&LStack_88,(String *)local_58);
    Log::operator<<(&local_78,(char *)&LStack_88);
    Log::addStringStream<int>(&local_38,(int)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&LStack_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
LAB_0018b115:
    this->mFd = -1;
  }
  this->mFileSize = 0;
  (this->mFilename).super_String.mString._M_string_length = 0;
  pcVar1 = (this->mFilename).super_String.mString._M_dataplus._M_p;
  *pcVar1 = '\0';
  this->mpMapped = (void *)0x0;
  this->mAccessType = NO_ACCESS;
  return (int)pcVar1;
}

Assistant:

void MemoryMappedFile::close()
{
#ifdef _WIN32
    if(mpMapped && !UnmapViewOfFile(mpMapped))
    {
        error() << "Could not UnmapViewOfFile(). GetLastError()="
                << GetLastError();
    }
    closeHandleIfValid(mhFileMapping);
    closeHandleIfValid(mhFile);

#else  // ifdef _WIN32
    if(mpMapped != nullptr && munmap(mpMapped, mFileSize) != 0)
    {
        error() << "Could not unmap " << mFilename
                << ". errno=" << errno;
    }

    if(mFd != -1)
    {
        int ret;
        eintrwrap(ret, ::close(mFd));

        if(ret == -1)
        {
            error() << "Could not close file " << mFilename
                    << ". errno=" << errno;
        }

        mFd = -1;
    }

#endif

    mFileSize = 0;
    mFilename.clear();
    mpMapped = nullptr;
    mAccessType = NO_ACCESS;
}